

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

int nni_http_set_version(nng_http *conn,char *vers)

{
  int iVar1;
  char *local_30;
  int local_24;
  int i;
  char *vers_local;
  nng_http *conn_local;
  
  local_30 = vers;
  if (vers == (char *)0x0) {
    local_30 = "HTTP/1.1";
  }
  local_24 = 0;
  while( true ) {
    if (nni_http_set_version::http_versions[local_24] == (char *)0x0) {
      return 9;
    }
    iVar1 = strcmp(local_30,nni_http_set_version::http_versions[local_24]);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  conn->vers = nni_http_set_version::http_versions[local_24];
  return 0;
}

Assistant:

int
nni_http_set_version(nng_http *conn, const char *vers)
{
	static const char *http_versions[] = {
		// for efficiency, we order in most likely first
		"HTTP/1.1",
		"HTTP/2",
		"HTTP/3",
		"HTTP/1.0",
		"HTTP/0.9",
		NULL,
	};

	vers = vers != NULL ? vers : NNG_HTTP_VERSION_1_1;
	for (int i = 0; http_versions[i] != NULL; i++) {
		if (strcmp(vers, http_versions[i]) == 0) {
			conn->vers = http_versions[i];
			return (NNG_OK);
		}
	}
	return (NNG_ENOTSUP);
}